

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mie.cpp
# Opt level: O2

void __thiscall
OpenMD::Mie::getMieFunc(Mie *this,RealType *r,int *n,int *m,RealType *pot,RealType *deriv)

{
  double __x;
  double dVar1;
  double dVar2;
  
  __x = 1.0 / *r;
  dVar1 = pow(__x,(double)*n);
  dVar2 = pow(__x,(double)*m);
  *pot = dVar1 - dVar2;
  *deriv = (double)*m * __x * dVar2 + (double)-*n * __x * dVar1;
  return;
}

Assistant:

void Mie::getMieFunc(const RealType& r, int& n, int& m, RealType& pot,
                       RealType& deriv) {
    RealType ri   = 1.0 / r;
    RealType rin  = pow(ri, n);
    RealType rim  = pow(ri, m);
    RealType rin1 = rin * ri;
    RealType rim1 = rim * ri;

    pot   = rin - rim;
    deriv = -n * rin1 + m * rim1;
    return;
  }